

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result_conflict1 __thiscall
testing::internal::
FunctionMocker<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
::PerformDefaultAction
          (FunctionMocker<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
           *this,ArgumentTuple *args,string *call_description)

{
  bool bVar1;
  OnCallSpec<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  *this_00;
  Action<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  *this_01;
  runtime_error *this_02;
  undefined1 local_60 [8];
  string message;
  OnCallSpec<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  *spec;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMocker<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  *this_local;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 ==
      (OnCallSpec<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
       *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    bVar1 = DefaultValue<int>::Exists();
    if (!bVar1) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,(string *)local_60);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local._4_4_ = DefaultValue<int>::Get();
    std::__cxx11::string::~string((string *)local_60);
  }
  else {
    this_01 = OnCallSpec<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
              ::GetAction(this_00);
    std::
    tuple<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int>
    ::tuple((tuple<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int>
             *)((long)&message.field_2 + 8),args);
    this_local._4_4_ =
         Action<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
         ::Perform(this_01,(ArgumentTuple *)((long)&message.field_2 + 8));
  }
  return this_local._4_4_;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }